

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::Precompute::create(Precompute *this)

{
  undefined1 uVar1;
  _func_int **pp_Var2;
  long in_RSI;
  
  pp_Var2 = (_func_int **)operator_new(0x180);
  uVar1 = *(undefined1 *)(in_RSI + 0x108);
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)(pp_Var2 + 4);
  pp_Var2[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 4) = 0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[0x20] = (_func_int *)0x0;
  pp_Var2[0x1e] = (_func_int *)0x0;
  pp_Var2[0x1f] = (_func_int *)0x0;
  pp_Var2[0x1c] = (_func_int *)0x0;
  pp_Var2[0x1d] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__Precompute_00d75028;
  *(undefined1 *)(pp_Var2 + 0x21) = uVar1;
  pp_Var2[0x22] = (_func_int *)(pp_Var2 + 0x28);
  pp_Var2[0x23] = (_func_int *)0x1;
  pp_Var2[0x24] = (_func_int *)0x0;
  pp_Var2[0x25] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 0x26) = 0x3f800000;
  pp_Var2[0x27] = (_func_int *)0x0;
  pp_Var2[0x28] = (_func_int *)0x0;
  pp_Var2[0x29] = (_func_int *)(pp_Var2 + 0x2f);
  pp_Var2[0x2a] = (_func_int *)0x1;
  pp_Var2[0x2b] = (_func_int *)0x0;
  pp_Var2[0x2c] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 0x2d) = 0x3f800000;
  pp_Var2[0x2e] = (_func_int *)0x0;
  pp_Var2[0x2f] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
  ).super_Pass._vptr_Pass = pp_Var2;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<Precompute>(propagate);
  }